

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPool::Tables::AddSymbol
          (Tables *this,string_view full_name,Symbol symbol)

{
  basic_string_view<char,_std::char_traits<char>_> *v1;
  basic_string_view<char,_std::char_traits<char>_> *v2;
  char *failure_msg;
  LogMessage *pLVar1;
  bool bVar2;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>::iterator,_bool>
  local_88;
  LogMessage local_60;
  Voidify local_49;
  string_view local_48;
  Nullable<const_char_*> local_38;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Tables *this_local;
  Symbol symbol_local;
  string_view full_name_local;
  
  symbol_local.ptr_ = (SymbolBase *)full_name._M_len;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)this;
  this_local = (Tables *)symbol.ptr_;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<std::basic_string_view<char,std::char_traits<char>>>
                 ((basic_string_view<char,_std::char_traits<char>_> *)&symbol_local);
  local_48 = Symbol::full_name((Symbol *)&this_local);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<std::basic_string_view<char,std::char_traits<char>>>(&local_48);
  local_38 = absl::lts_20250127::log_internal::
             Check_EQImpl<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                       (v1,v2,"full_name == symbol.full_name()");
  if (local_38 == (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
    ::insert<google::protobuf::Symbol,_0>
              (&local_88,
               &(this->symbols_by_name_).
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
               ,(Symbol *)&this_local);
    bVar2 = (local_88.second & 1U) != 0;
    if (bVar2) {
      std::vector<google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>_>::push_back
                (&this->symbols_after_checkpoint_,(value_type *)&this_local);
    }
    return bVar2;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_38);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
             ,0x88d,failure_msg);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_60);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_49,pLVar1);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_60);
}

Assistant:

bool DescriptorPool::Tables::AddSymbol(absl::string_view full_name,
                                       Symbol symbol) {
  ABSL_DCHECK_EQ(full_name, symbol.full_name());
  if (symbols_by_name_.insert(symbol).second) {
    symbols_after_checkpoint_.push_back(symbol);
    return true;
  } else {
    return false;
  }
}